

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O3

void __thiscall
TPZSYsmpMatrix<double>::TPZSYsmpMatrix(TPZSYsmpMatrix<double> *this,int64_t rows,int64_t cols)

{
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = cols;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSYsmpMatrix_018554d0;
  (this->fIA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fIA).fStore = (long *)0x0;
  (this->fIA).fNElements = 0;
  (this->fIA).fNAlloc = 0;
  (this->fJA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fJA).fStore = (long *)0x0;
  (this->fJA).fNElements = 0;
  (this->fJA).fNAlloc = 0;
  (this->fA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fA).fStore = (double *)0x0;
  (this->fA).fNElements = 0;
  (this->fA).fNAlloc = 0;
  TPZPardisoSolver<double>::TPZPardisoSolver(&this->fPardisoControl);
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fDiag).fStore = (double *)0x0;
  (this->fDiag).fNElements = 0;
  (this->fDiag).fNAlloc = 0;
  return;
}

Assistant:

TPZSYsmpMatrix<TVar>::TPZSYsmpMatrix(const int64_t rows,const int64_t cols ) : TPZRegisterClassId(&TPZSYsmpMatrix::ClassId),
TPZMatrix<TVar>(rows,cols) {

#ifdef CONSTRUCTOR
	cerr << "TPZSYsmpMatrix(int rows,int cols)\n";
#endif
}